

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O2

void __thiscall PerseusStationary::Load(PerseusStationary *this,string *filename)

{
  ValueFunctionPOMDPDiscrete VStack_28;
  
  AlphaVectorPlanning::ImportValueFunction(&VStack_28,filename);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::_M_move_assign
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)&(this->super_Perseus).field_0x90,
             &VStack_28);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&VStack_28);
  return;
}

Assistant:

void PerseusStationary::Load(const std::string &filename)
{
    _m_valueFunction=ImportValueFunction(filename);
}